

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# entropy_encode.c
# Opt level: O2

void BrotliOptimizeHuffmanCountsForRle(size_t length,uint32_t *counts,uint8_t *good_for_rle)

{
  uint uVar1;
  uint uVar2;
  size_t nonzeros;
  ulong uVar3;
  uint8_t *puVar4;
  ulong uVar5;
  uint32_t uVar6;
  size_t sVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  uint uVar11;
  ulong uVar12;
  uint32_t *puVar13;
  
  uVar3 = 0;
  for (sVar7 = 0; length != sVar7; sVar7 = sVar7 + 1) {
    uVar3 = (uVar3 + 1) - (ulong)(counts[sVar7] == 0);
  }
  if (0xf < uVar3) {
    puVar13 = counts + -1;
    for (; length != 0; length = length - 1) {
      if (puVar13[length] != 0) {
        uVar2 = 0x40000000;
        uVar3 = 0;
        for (uVar8 = 0; length != uVar8; uVar8 = uVar8 + 1) {
          uVar1 = counts[uVar8];
          uVar11 = uVar1;
          if (uVar2 < uVar1) {
            uVar11 = uVar2;
          }
          if (uVar1 != 0) {
            uVar2 = uVar11;
          }
          uVar3 = uVar3 + (uVar1 != 0);
        }
        if (uVar3 < 5) {
          return;
        }
        if ((uVar2 < 4) && (length - uVar3 < 6)) {
          for (uVar8 = 1; uVar8 < length - 1; uVar8 = uVar8 + 1) {
            if (((counts[uVar8 - 1] != 0) && (counts[uVar8] == 0)) && (counts[uVar8 + 1] != 0)) {
              counts[uVar8] = 1;
            }
          }
        }
        if (uVar3 < 0x1c) {
          return;
        }
        memset(good_for_rle,0,length);
        uVar6 = *counts;
        puVar4 = good_for_rle + -1;
        uVar3 = 0;
        for (uVar8 = 0; uVar8 <= length; uVar8 = uVar8 + 1) {
          if ((uVar8 == length) || (counts[uVar8] != uVar6)) {
            if ((uVar6 == 0 && 4 < uVar3) || (6 < uVar3 && uVar6 != 0)) {
              for (lVar10 = 0; -lVar10 != uVar3; lVar10 = lVar10 + -1) {
                puVar4[lVar10] = '\x01';
              }
            }
            uVar3 = 1;
            if (length != uVar8) {
              uVar6 = counts[uVar8];
            }
          }
          else {
            uVar3 = uVar3 + 1;
          }
          puVar4 = puVar4 + 1;
        }
        uVar3 = (ulong)(((counts[1] + *counts + counts[2]) * 0x100) / 3 + 0x1a4);
        uVar8 = 0;
        uVar9 = 0;
        for (uVar12 = 0; uVar12 <= length; uVar12 = uVar12 + 1) {
          if ((((uVar12 == length) || (good_for_rle[uVar12] != '\0')) ||
              ((uVar12 != 0 && (good_for_rle[uVar12 - 1] != '\0')))) ||
             (((counts[uVar12] << 8) - uVar3) - 0x4d8 < 0xfffffffffffff650)) {
            if ((3 < uVar8) || ((uVar8 == 3 && (uVar9 == 0)))) {
              uVar3 = (uVar8 >> 1) + uVar9;
              uVar6 = (uint32_t)(uVar3 / uVar8);
              if (uVar3 < uVar8) {
                uVar6 = 1;
              }
              if (uVar9 == 0) {
                uVar6 = 0;
              }
              for (lVar10 = 0; -lVar10 != uVar8; lVar10 = lVar10 + -1) {
                puVar13[lVar10] = uVar6;
              }
            }
            if (uVar12 < length - 2) {
              uVar2 = ((counts[uVar12 + 1] + counts[uVar12] + counts[uVar12 + 2]) * 0x100) / 3 +
                      0x1a4;
            }
            else {
              uVar2 = 0;
              if (uVar12 < length) {
                uVar2 = counts[uVar12] << 8;
              }
            }
            uVar3 = (ulong)uVar2;
            uVar8 = 1;
            if (length == uVar12) {
              uVar9 = 0;
            }
            else {
              uVar9 = (ulong)counts[uVar12];
            }
          }
          else {
            uVar8 = uVar8 + 1;
            uVar9 = uVar9 + counts[uVar12];
            if (3 < uVar8) {
              uVar5 = ((uVar8 >> 1) + uVar9 * 0x100) / uVar8;
              uVar3 = uVar5 + 0x78;
              if (uVar8 != 4) {
                uVar3 = uVar5;
              }
            }
          }
          puVar13 = puVar13 + 1;
        }
        return;
      }
    }
  }
  return;
}

Assistant:

void BrotliOptimizeHuffmanCountsForRle(size_t length, uint32_t* counts,
                                       uint8_t* good_for_rle) {
  size_t nonzero_count = 0;
  size_t stride;
  size_t limit;
  size_t sum;
  const size_t streak_limit = 1240;
  /* Let's make the Huffman code more compatible with RLE encoding. */
  size_t i;
  for (i = 0; i < length; i++) {
    if (counts[i]) {
      ++nonzero_count;
    }
  }
  if (nonzero_count < 16) {
    return;
  }
  while (length != 0 && counts[length - 1] == 0) {
    --length;
  }
  if (length == 0) {
    return;  /* All zeros. */
  }
  /* Now counts[0..length - 1] does not have trailing zeros. */
  {
    size_t nonzeros = 0;
    uint32_t smallest_nonzero = 1 << 30;
    for (i = 0; i < length; ++i) {
      if (counts[i] != 0) {
        ++nonzeros;
        if (smallest_nonzero > counts[i]) {
          smallest_nonzero = counts[i];
        }
      }
    }
    if (nonzeros < 5) {
      /* Small histogram will model it well. */
      return;
    }
    if (smallest_nonzero < 4) {
      size_t zeros = length - nonzeros;
      if (zeros < 6) {
        for (i = 1; i < length - 1; ++i) {
          if (counts[i - 1] != 0 && counts[i] == 0 && counts[i + 1] != 0) {
            counts[i] = 1;
          }
        }
      }
    }
    if (nonzeros < 28) {
      return;
    }
  }
  /* 2) Let's mark all population counts that already can be encoded
     with an RLE code. */
  memset(good_for_rle, 0, length);
  {
    /* Let's not spoil any of the existing good RLE codes.
       Mark any seq of 0's that is longer as 5 as a good_for_rle.
       Mark any seq of non-0's that is longer as 7 as a good_for_rle. */
    uint32_t symbol = counts[0];
    size_t step = 0;
    for (i = 0; i <= length; ++i) {
      if (i == length || counts[i] != symbol) {
        if ((symbol == 0 && step >= 5) ||
            (symbol != 0 && step >= 7)) {
          size_t k;
          for (k = 0; k < step; ++k) {
            good_for_rle[i - k - 1] = 1;
          }
        }
        step = 1;
        if (i != length) {
          symbol = counts[i];
        }
      } else {
        ++step;
      }
    }
  }
  /* 3) Let's replace those population counts that lead to more RLE codes.
     Math here is in 24.8 fixed point representation. */
  stride = 0;
  limit = 256 * (counts[0] + counts[1] + counts[2]) / 3 + 420;
  sum = 0;
  for (i = 0; i <= length; ++i) {
    if (i == length || good_for_rle[i] ||
        (i != 0 && good_for_rle[i - 1]) ||
        (256 * counts[i] - limit + streak_limit) >= 2 * streak_limit) {
      if (stride >= 4 || (stride >= 3 && sum == 0)) {
        size_t k;
        /* The stride must end, collapse what we have, if we have enough (4). */
        size_t count = (sum + stride / 2) / stride;
        if (count == 0) {
          count = 1;
        }
        if (sum == 0) {
          /* Don't make an all zeros stride to be upgraded to ones. */
          count = 0;
        }
        for (k = 0; k < stride; ++k) {
          /* We don't want to change value at counts[i],
             that is already belonging to the next stride. Thus - 1. */
          counts[i - k - 1] = (uint32_t)count;
        }
      }
      stride = 0;
      sum = 0;
      if (i < length - 2) {
        /* All interesting strides have a count of at least 4, */
        /* at least when non-zeros. */
        limit = 256 * (counts[i] + counts[i + 1] + counts[i + 2]) / 3 + 420;
      } else if (i < length) {
        limit = 256 * counts[i];
      } else {
        limit = 0;
      }
    }
    ++stride;
    if (i != length) {
      sum += counts[i];
      if (stride >= 4) {
        limit = (256 * sum + stride / 2) / stride;
      }
      if (stride == 4) {
        limit += 120;
      }
    }
  }
}